

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceTexelFetch_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,DataType samplerDataType,DataType pDataType,DataType sampleDataType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  DataType dataType;
  uint uVar4;
  allocator<char> local_2ae;
  allocator<char> local_2ad;
  DataType local_2ac;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream source;
  
  shaderType_00 = shaderType;
  local_2ac = pDataType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(**(long **)(this + 0x20) + 0x10))();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar3 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  getDataTypeExtension_abi_cxx11_(&local_1c8,(_anonymous_namespace_ *)(ulong)shaderType,dataType);
  NegativeTestShared::anon_unknown_0::getShaderExtensionDeclaration(&local_2a8,&local_1c8);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
  getShaderInitialization_abi_cxx11_
            (&local_288,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"sampler",&local_2ad);
  NegativeTestShared::anon_unknown_0::declareShaderUniform(&local_1e8,shaderType,&local_208);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"P",&local_2ae);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_228,samplerDataType,&local_248);
  std::operator<<(poVar3,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  uVar4 = shaderType - 0x42;
  if (uVar4 < 0x19) {
    if ((0x1c00007U >> (uVar4 & 0x1f) & 1) == 0) {
      if ((0x380000U >> (uVar4 & 0x1f) & 1) != 0) {
        std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                        "    texelFetch(sampler, P);\n");
      }
    }
    else {
      poVar3 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,"    ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,"varSample",(allocator<char> *)&local_288);
      NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
                (&local_2a8,local_2ac,&local_268);
      poVar3 = std::operator<<(poVar3,(string *)&local_2a8);
      std::operator<<(poVar3,"    texelFetch(sampler, P, varSample);\n");
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_268);
    }
  }
  std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceTexelFetch (NegativeTestContext& ctx, glu::ShaderType shaderType, glu::DataType samplerDataType, glu::DataType pDataType, glu::DataType sampleDataType)
{
	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderExtensionDeclaration(getDataTypeExtension(samplerDataType))
			<< getShaderInitialization(ctx, shaderType)
			<< declareShaderUniform(samplerDataType, "sampler")
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(pDataType, "P");

	switch (samplerDataType)
	{
		case glu::TYPE_SAMPLER_2D_MULTISAMPLE:
		case glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE:
		case glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE:
		case glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY:
			source	<< "    " << declareAndInitializeShaderVariable(sampleDataType, "varSample")
					<< "    texelFetch(sampler, P, varSample);\n";
			break;

		case glu::TYPE_SAMPLER_BUFFER:
		case glu::TYPE_INT_SAMPLER_BUFFER:
		case glu::TYPE_UINT_SAMPLER_BUFFER:
			source << "    texelFetch(sampler, P);\n";
			break;

		default:
			DE_FATAL("Unsupported data type.");
	}

	source << "}\n";

	return source.str();
}